

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int amqpvalue_get_properties(AMQP_VALUE value,PROPERTIES_HANDLE *properties_handle)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE pAVar3;
  char *local_90;
  char *reply_to_group_id;
  sequence_no group_sequence;
  char *group_id;
  timestamp creation_time;
  timestamp absolute_expiry_time;
  char *content_encoding;
  char *content_type;
  char *subject;
  amqp_binary user_id;
  AMQP_VALUE item_value;
  AMQP_VALUE pAStack_30;
  uint32_t list_item_count;
  AMQP_VALUE list_value;
  PROPERTIES_INSTANCE *properties_instance;
  PROPERTIES_HANDLE *ppPStack_18;
  int result;
  PROPERTIES_HANDLE *properties_handle_local;
  AMQP_VALUE value_local;
  
  ppPStack_18 = properties_handle;
  properties_handle_local = (PROPERTIES_HANDLE *)value;
  list_value = (AMQP_VALUE)properties_create_internal();
  *ppPStack_18 = (PROPERTIES_HANDLE)list_value;
  if (*ppPStack_18 == (PROPERTIES_HANDLE)0x0) {
    properties_instance._4_4_ = 0x3d3c;
  }
  else {
    pAStack_30 = amqpvalue_get_inplace_described_value((AMQP_VALUE)properties_handle_local);
    if (pAStack_30 == (AMQP_VALUE)0x0) {
      properties_destroy(*ppPStack_18);
      properties_instance._4_4_ = 0x3d44;
    }
    else {
      iVar1 = amqpvalue_get_list_item_count(pAStack_30,(uint32_t *)((long)&item_value + 4));
      if (iVar1 == 0) {
        if ((item_value._4_4_ != 0) &&
           (user_id._8_8_ = amqpvalue_get_list_item(pAStack_30,0),
           (AMQP_VALUE)user_id._8_8_ != (AMQP_VALUE)0x0)) {
          amqpvalue_destroy((AMQP_VALUE)user_id._8_8_);
        }
        if ((1 < item_value._4_4_) &&
           (user_id._8_8_ = amqpvalue_get_list_item(pAStack_30,1),
           (AMQP_VALUE)user_id._8_8_ != (AMQP_VALUE)0x0)) {
          AVar2 = amqpvalue_get_type((AMQP_VALUE)user_id._8_8_);
          if ((AVar2 != AMQP_TYPE_NULL) &&
             (iVar1 = amqpvalue_get_binary((AMQP_VALUE)user_id._8_8_,(amqp_binary *)&subject),
             iVar1 != 0)) {
            amqpvalue_destroy((AMQP_VALUE)user_id._8_8_);
            properties_destroy(*ppPStack_18);
            return 0x3d74;
          }
          amqpvalue_destroy((AMQP_VALUE)user_id._8_8_);
        }
        if ((2 < item_value._4_4_) &&
           (user_id._8_8_ = amqpvalue_get_list_item(pAStack_30,2),
           (AMQP_VALUE)user_id._8_8_ != (AMQP_VALUE)0x0)) {
          amqpvalue_destroy((AMQP_VALUE)user_id._8_8_);
        }
        if ((3 < item_value._4_4_) &&
           (user_id._8_8_ = amqpvalue_get_list_item(pAStack_30,3),
           (AMQP_VALUE)user_id._8_8_ != (AMQP_VALUE)0x0)) {
          AVar2 = amqpvalue_get_type((AMQP_VALUE)user_id._8_8_);
          if ((AVar2 != AMQP_TYPE_NULL) &&
             (iVar1 = amqpvalue_get_string((AMQP_VALUE)user_id._8_8_,&content_type), iVar1 != 0)) {
            amqpvalue_destroy((AMQP_VALUE)user_id._8_8_);
            properties_destroy(*ppPStack_18);
            return 0x3d9e;
          }
          amqpvalue_destroy((AMQP_VALUE)user_id._8_8_);
        }
        if ((4 < item_value._4_4_) &&
           (user_id._8_8_ = amqpvalue_get_list_item(pAStack_30,4),
           (AMQP_VALUE)user_id._8_8_ != (AMQP_VALUE)0x0)) {
          amqpvalue_destroy((AMQP_VALUE)user_id._8_8_);
        }
        if ((5 < item_value._4_4_) &&
           (user_id._8_8_ = amqpvalue_get_list_item(pAStack_30,5),
           (AMQP_VALUE)user_id._8_8_ != (AMQP_VALUE)0x0)) {
          amqpvalue_destroy((AMQP_VALUE)user_id._8_8_);
        }
        if ((6 < item_value._4_4_) &&
           (user_id._8_8_ = amqpvalue_get_list_item(pAStack_30,6),
           (AMQP_VALUE)user_id._8_8_ != (AMQP_VALUE)0x0)) {
          AVar2 = amqpvalue_get_type((AMQP_VALUE)user_id._8_8_);
          if ((AVar2 != AMQP_TYPE_NULL) &&
             (iVar1 = amqpvalue_get_symbol((AMQP_VALUE)user_id._8_8_,&content_encoding), iVar1 != 0)
             ) {
            amqpvalue_destroy((AMQP_VALUE)user_id._8_8_);
            properties_destroy(*ppPStack_18);
            return 0x3dd5;
          }
          amqpvalue_destroy((AMQP_VALUE)user_id._8_8_);
        }
        if ((7 < item_value._4_4_) &&
           (user_id._8_8_ = amqpvalue_get_list_item(pAStack_30,7),
           (AMQP_VALUE)user_id._8_8_ != (AMQP_VALUE)0x0)) {
          AVar2 = amqpvalue_get_type((AMQP_VALUE)user_id._8_8_);
          if ((AVar2 != AMQP_TYPE_NULL) &&
             (iVar1 = amqpvalue_get_symbol((AMQP_VALUE)user_id._8_8_,(char **)&absolute_expiry_time)
             , iVar1 != 0)) {
            amqpvalue_destroy((AMQP_VALUE)user_id._8_8_);
            properties_destroy(*ppPStack_18);
            return 0x3df2;
          }
          amqpvalue_destroy((AMQP_VALUE)user_id._8_8_);
        }
        if ((8 < item_value._4_4_) &&
           (user_id._8_8_ = amqpvalue_get_list_item(pAStack_30,8),
           (AMQP_VALUE)user_id._8_8_ != (AMQP_VALUE)0x0)) {
          AVar2 = amqpvalue_get_type((AMQP_VALUE)user_id._8_8_);
          if ((AVar2 != AMQP_TYPE_NULL) &&
             (iVar1 = amqpvalue_get_timestamp((AMQP_VALUE)user_id._8_8_,&creation_time), iVar1 != 0)
             ) {
            amqpvalue_destroy((AMQP_VALUE)user_id._8_8_);
            properties_destroy(*ppPStack_18);
            return 0x3e0f;
          }
          amqpvalue_destroy((AMQP_VALUE)user_id._8_8_);
        }
        if ((9 < item_value._4_4_) &&
           (user_id._8_8_ = amqpvalue_get_list_item(pAStack_30,9),
           (AMQP_VALUE)user_id._8_8_ != (AMQP_VALUE)0x0)) {
          AVar2 = amqpvalue_get_type((AMQP_VALUE)user_id._8_8_);
          if ((AVar2 != AMQP_TYPE_NULL) &&
             (iVar1 = amqpvalue_get_timestamp((AMQP_VALUE)user_id._8_8_,(int64_t *)&group_id),
             iVar1 != 0)) {
            amqpvalue_destroy((AMQP_VALUE)user_id._8_8_);
            properties_destroy(*ppPStack_18);
            return 0x3e2c;
          }
          amqpvalue_destroy((AMQP_VALUE)user_id._8_8_);
        }
        if ((10 < item_value._4_4_) &&
           (user_id._8_8_ = amqpvalue_get_list_item(pAStack_30,10),
           (AMQP_VALUE)user_id._8_8_ != (AMQP_VALUE)0x0)) {
          AVar2 = amqpvalue_get_type((AMQP_VALUE)user_id._8_8_);
          if ((AVar2 != AMQP_TYPE_NULL) &&
             (iVar1 = amqpvalue_get_string
                                ((AMQP_VALUE)user_id._8_8_,(char **)&stack0xffffffffffffff80),
             iVar1 != 0)) {
            amqpvalue_destroy((AMQP_VALUE)user_id._8_8_);
            properties_destroy(*ppPStack_18);
            return 0x3e49;
          }
          amqpvalue_destroy((AMQP_VALUE)user_id._8_8_);
        }
        if ((0xb < item_value._4_4_) &&
           (user_id._8_8_ = amqpvalue_get_list_item(pAStack_30,0xb),
           (AMQP_VALUE)user_id._8_8_ != (AMQP_VALUE)0x0)) {
          AVar2 = amqpvalue_get_type((AMQP_VALUE)user_id._8_8_);
          if ((AVar2 != AMQP_TYPE_NULL) &&
             (iVar1 = amqpvalue_get_uint((AMQP_VALUE)user_id._8_8_,
                                         (uint32_t *)((long)&reply_to_group_id + 4)), iVar1 != 0)) {
            amqpvalue_destroy((AMQP_VALUE)user_id._8_8_);
            properties_destroy(*ppPStack_18);
            return 0x3e66;
          }
          amqpvalue_destroy((AMQP_VALUE)user_id._8_8_);
        }
        if ((0xc < item_value._4_4_) &&
           (user_id._8_8_ = amqpvalue_get_list_item(pAStack_30,0xc),
           (AMQP_VALUE)user_id._8_8_ != (AMQP_VALUE)0x0)) {
          AVar2 = amqpvalue_get_type((AMQP_VALUE)user_id._8_8_);
          if ((AVar2 != AMQP_TYPE_NULL) &&
             (iVar1 = amqpvalue_get_string((AMQP_VALUE)user_id._8_8_,&local_90), iVar1 != 0)) {
            amqpvalue_destroy((AMQP_VALUE)user_id._8_8_);
            properties_destroy(*ppPStack_18);
            return 0x3e83;
          }
          amqpvalue_destroy((AMQP_VALUE)user_id._8_8_);
        }
        pAVar3 = amqpvalue_clone((AMQP_VALUE)properties_handle_local);
        *(AMQP_VALUE *)list_value = pAVar3;
        properties_instance._4_4_ = 0;
      }
      else {
        properties_instance._4_4_ = 0x3d4b;
      }
    }
  }
  return properties_instance._4_4_;
}

Assistant:

int amqpvalue_get_properties(AMQP_VALUE value, PROPERTIES_HANDLE* properties_handle)
{
    int result;
    PROPERTIES_INSTANCE* properties_instance = (PROPERTIES_INSTANCE*)properties_create_internal();
    *properties_handle = properties_instance;
    if (*properties_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            properties_destroy(*properties_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* message-id */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* user-id */
                    if (list_item_count > 1)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 1);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                amqp_binary user_id;
                                if (amqpvalue_get_binary(item_value, &user_id) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    properties_destroy(*properties_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* to */
                    if (list_item_count > 2)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 2);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* subject */
                    if (list_item_count > 3)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 3);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* subject;
                                if (amqpvalue_get_string(item_value, &subject) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    properties_destroy(*properties_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* reply-to */
                    if (list_item_count > 4)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 4);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* correlation-id */
                    if (list_item_count > 5)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 5);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* content-type */
                    if (list_item_count > 6)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 6);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* content_type;
                                if (amqpvalue_get_symbol(item_value, &content_type) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    properties_destroy(*properties_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* content-encoding */
                    if (list_item_count > 7)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 7);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* content_encoding;
                                if (amqpvalue_get_symbol(item_value, &content_encoding) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    properties_destroy(*properties_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* absolute-expiry-time */
                    if (list_item_count > 8)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 8);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                timestamp absolute_expiry_time;
                                if (amqpvalue_get_timestamp(item_value, &absolute_expiry_time) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    properties_destroy(*properties_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* creation-time */
                    if (list_item_count > 9)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 9);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                timestamp creation_time;
                                if (amqpvalue_get_timestamp(item_value, &creation_time) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    properties_destroy(*properties_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* group-id */
                    if (list_item_count > 10)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 10);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* group_id;
                                if (amqpvalue_get_string(item_value, &group_id) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    properties_destroy(*properties_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* group-sequence */
                    if (list_item_count > 11)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 11);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                sequence_no group_sequence;
                                if (amqpvalue_get_sequence_no(item_value, &group_sequence) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    properties_destroy(*properties_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* reply-to-group-id */
                    if (list_item_count > 12)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 12);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* reply_to_group_id;
                                if (amqpvalue_get_string(item_value, &reply_to_group_id) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    properties_destroy(*properties_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }

                    properties_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}